

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O1

lyd_node *
lyd_parse_json(ly_ctx *ctx,char *data,int options,lyd_node *rpc_act,lyd_node *data_tree,
              char *yang_data_name)

{
  byte bVar1;
  LYS_NODE LVar2;
  ly_ctx *ctx_00;
  uint len_1;
  uint uVar3;
  int iVar4;
  uint uVar5;
  lys_node *plVar6;
  lys_node *node;
  lys_node *plVar7;
  lyd_node *plVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  LY_ERR LVar12;
  undefined1 root [8];
  char *pcVar13;
  undefined1 local_88 [8];
  attr_cont *attrs;
  lyd_node *next;
  lyd_node *local_70;
  lyd_node *local_68;
  lys_node *local_60;
  undefined1 local_58 [8];
  lyd_node *act_notif;
  ly_ctx *local_48;
  lys_node *local_40;
  lys_node *local_38;
  lyd_node *result;
  
  plVar6 = (lys_node *)(ulong)(uint)options;
  local_38 = (lys_node *)0x0;
  local_58 = (undefined1  [8])0x0;
  local_88 = (undefined1  [8])0x0;
  if (data == (char *)0x0 || ctx == (ly_ctx *)0x0) {
    pcVar13 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    LVar12 = LY_EINVAL;
LAB_00140d15:
    ly_log(ctx,LY_LLERR,LVar12,pcVar13,"lyd_parse_json");
    return (lyd_node *)0x0;
  }
  uVar3 = 1;
  while( true ) {
    uVar10 = (ulong)(uVar3 - 1);
    bVar1 = data[uVar10];
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    uVar3 = uVar3 + 1;
  }
  next = rpc_act;
  if (bVar1 != 0x7b) {
    ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"JSON data (missing top level begin-object)")
    ;
    return (lyd_node *)0x0;
  }
  uVar9 = (ulong)uVar3;
  uVar11 = 0;
  while (((ulong)(byte)data[uVar11 + uVar9] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)data[uVar11 + uVar9] & 0x3f) & 1) != 0))) {
    uVar11 = uVar11 + 1;
    uVar3 = uVar3 + 1;
  }
  if (data[uVar3] == '}') {
    if (((uint)options >> 0x11 & 1) != 0) {
      local_38 = (lys_node *)ly_ctx_info(ctx);
    }
    lyd_validate((lyd_node **)&local_38,options,ctx);
    return (lyd_node *)local_38;
  }
  local_68 = (lyd_node *)calloc(1,0x28);
  if (local_68 == (lyd_node *)0x0) {
    pcVar13 = "Memory allocation failed (%s()).";
    LVar12 = LY_EMEM;
    local_68 = (lyd_node *)0x0;
    goto LAB_00140d15;
  }
  local_70 = (lyd_node *)0x0;
  local_40 = plVar6;
  if (next == (lyd_node *)0x0) {
    plVar6 = (lys_node *)0x0;
    act_notif = (lyd_node *)0x0;
    local_48 = ctx;
  }
  else {
    if ((options & 0x20U) == 0) {
      __assert_fail("options & LYD_OPT_RPCREPLY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_json.c"
                    ,0x541,
                    "struct lyd_node *lyd_parse_json(struct ly_ctx *, const char *, int, const struct lyd_node *, const struct lyd_node *, const char *)"
                   );
    }
    if (next->schema->nodetype != LYS_RPC) {
      node = (lys_node *)lyd_dup(next,1);
      plVar7 = node;
joined_r0x00140e4c:
      plVar6 = plVar7;
      if (plVar6 != (lys_node *)0x0) {
        LVar2 = ((lys_node *)plVar6->name)->nodetype;
        if (LVar2 == LYS_ACTION) {
LAB_00140ec7:
          act_notif = (lyd_node *)node;
          local_48 = ctx;
          lyd_free_withsiblings((lyd_node *)plVar6->parent);
          goto LAB_00140ede;
        }
        if ((LVar2 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar7 = plVar6->parent;
        }
        else {
          plVar7 = (lys_node *)0x0;
        }
        if (plVar7 == (lys_node *)0x0) {
          if (plVar6 == node) goto LAB_00140ec7;
          plVar7 = *(lys_node **)&plVar6->flags;
        }
        if (plVar7 == (lys_node *)0x0) {
          do {
            plVar6 = (lys_node *)plVar6->iffeature;
            if ((lyd_node *)plVar6->iffeature == (lyd_node *)node->iffeature) break;
            plVar7 = *(lys_node **)&plVar6->flags;
          } while (plVar7 == (lys_node *)0x0);
        }
        goto joined_r0x00140e4c;
      }
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_json");
      goto LAB_0014111d;
    }
    local_48 = ctx;
    plVar6 = (lys_node *)_lyd_new((lyd_node *)0x0,next->schema,0);
    act_notif = (lyd_node *)plVar6;
  }
LAB_00140ede:
  plVar8 = (lyd_node *)0x0;
  attrs = (attr_cont *)plVar6;
  local_60 = plVar6;
  do {
    uVar3 = (int)uVar10 + 1;
    uVar11 = (int)uVar10 + 0x10;
    uVar10 = 0;
    while( true ) {
      if ((0x20 < (ulong)(byte)data[uVar10 + uVar3]) ||
         ((0x100002600U >> ((ulong)(byte)data[uVar10 + uVar3] & 0x3f) & 1) == 0)) break;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar11 = uVar11 + 1;
    }
    uVar3 = (int)uVar10 + uVar3;
    uVar10 = (ulong)uVar3;
    if ((int)local_70 == 0) {
      iVar4 = strncmp(data + uVar10,"\"yang:action\"",0xd);
      local_70 = (lyd_node *)0xffffffff;
      if (iVar4 == 0) {
        uVar3 = uVar3 + 0xd;
        uVar5 = 0;
        while (((ulong)(byte)data[(ulong)uVar5 + (ulong)uVar3] < 0x21 &&
               ((0x100002600U >> ((ulong)(byte)data[(ulong)uVar5 + (ulong)uVar3] & 0x3f) & 1) != 0))
              ) {
          uVar5 = uVar5 + 1;
          uVar11 = uVar11 + 1;
        }
        uVar5 = uVar5 + uVar3;
        if (data[uVar5] != ':') {
          pcVar13 = "JSON data (missing top-level begin-object)";
          goto LAB_00141105;
        }
        uVar10 = 0;
        while( true ) {
          if ((0x20 < (ulong)(byte)data[uVar10 + (uVar5 + 1)]) ||
             ((0x100002600U >> ((ulong)(byte)data[uVar10 + (uVar5 + 1)] & 0x3f) & 1) == 0)) break;
          uVar10 = (ulong)((int)uVar10 + 1);
          uVar11 = uVar11 + 1;
        }
        if (data[uVar11 - 1] != '{') {
          pcVar13 = "JSON data (missing top level yang:action object)";
          goto LAB_00141105;
        }
        uVar3 = 0;
        while (((ulong)(byte)data[(ulong)uVar3 + (ulong)uVar11] < 0x21 &&
               ((0x100002600U >> ((ulong)(byte)data[(ulong)uVar3 + (ulong)uVar11] & 0x3f) & 1) != 0)
               )) {
          uVar3 = uVar3 + 1;
        }
        local_70 = (lyd_node *)&DAT_00000001;
        uVar10 = (ulong)(uVar11 + uVar3);
      }
    }
    uVar3 = json_parse_data(local_48,data + uVar10,(lys_node *)&attrs,(lyd_node **)local_38,plVar8,
                            (lyd_node *)local_88,(attr_cont **)local_40,(int)local_68,
                            (unres_data *)local_58,(lyd_node **)yang_data_name,yang_data_name);
    ctx_00 = local_48;
    node = (lys_node *)act_notif;
    if (uVar3 == 0) goto LAB_0014111d;
    plVar6 = local_40;
    if (local_38 == (lys_node *)0x0) {
      plVar7 = (lys_node *)attrs;
      if (local_60 == (lys_node *)0x0) {
        do {
          local_38 = plVar7;
          plVar8 = (lyd_node *)attrs;
          if (local_38 == (lys_node *)0x0) goto LAB_00141027;
          plVar7 = (lys_node *)local_38->ext;
        } while (*(lyd_node **)&((lys_node *)local_38->ext)->flags != (lyd_node *)0x0);
        if ((((uint)local_40 >> 0x11 & 1) != 0) &&
           (plVar6 = (lys_node *)(ulong)((uint)local_40 & 0xfffdffff),
           ((lys_node *)local_38->name)->module !=
           (local_48->models).list[(ulong)local_48->internal_module_count - 1])) {
          plVar6 = (lys_node *)((ulong)local_40 & 0xffffffff);
        }
      }
      else {
        local_38 = (lys_node *)attrs[2].next;
        if (local_38 == (lys_node *)0x0) {
          plVar8 = (lyd_node *)0x0;
        }
        else {
          plVar8 = (lyd_node *)local_38->ext;
        }
      }
    }
    else {
      plVar8 = (lyd_node *)local_38->ext;
    }
LAB_00141027:
    local_40 = plVar6;
    if (local_60 == (lys_node *)0x0) {
      attrs = (attr_cont *)0x0;
    }
    uVar3 = uVar3 + (int)uVar10;
    uVar10 = (ulong)uVar3;
  } while (data[uVar10] == ',');
  if (data[uVar10] != '}') {
    pcVar13 = "JSON data (missing top-level end-object)";
LAB_00141105:
    ly_vlog(local_48,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar13);
    node = (lys_node *)act_notif;
    goto LAB_0014111d;
  }
  uVar3 = uVar3 + 1;
  uVar11 = 0;
  while (((ulong)(byte)data[(ulong)uVar11 + (ulong)uVar3] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)data[(ulong)uVar11 + (ulong)uVar3] & 0x3f) & 1) != 0))) {
    uVar11 = uVar11 + 1;
  }
  if (((int)local_70 == 1) && (data[uVar3 + uVar11] != '}')) {
    ly_vlog(local_48,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
            "JSON data (missing top-level end-object)");
    goto LAB_0014111d;
  }
  iVar4 = store_attrs(local_48,(attr_cont *)local_88,(lyd_node *)local_38,(int)local_40);
  plVar8 = next;
  if (iVar4 != 0) goto LAB_0014111d;
  if (node != (lys_node *)0x0) {
    local_38 = node;
  }
  if (local_38 == (lys_node *)0x0) {
    pcVar13 = "Model for the data to be linked with not found.";
    LVar12 = LY_EVALID;
LAB_0014127c:
    ly_log(ctx_00,LY_LLERR,LVar12,pcVar13);
  }
  else {
    if ((((ulong)local_40 & 0x30) != 0) &&
       (iVar4 = lyd_schema_sort((lyd_node *)local_38,1), iVar4 != 0)) goto LAB_0014111d;
    plVar6 = local_38;
    if ((((ulong)local_40 & 0x20) == 0) || (plVar8->schema->nodetype == LYS_RPC)) {
      if ((((ulong)local_40 & 0x50) != 0) && (local_58 == (undefined1  [8])0x0)) {
        pcVar13 = "action";
        if (((ulong)local_40 & 0x10) == 0) {
          pcVar13 = "notification";
        }
        ly_vlog(ctx_00,LYE_MISSELEM,LY_VLOG_LYD,local_38,pcVar13,((lys_node *)local_38->name)->name)
        ;
        goto LAB_0014111d;
      }
    }
    else {
      local_58 = (undefined1  [8])local_60;
    }
    if (((uint)local_40 >> 0x11 & 1) != 0) {
      plVar8 = ly_ctx_info(ctx_00);
      iVar4 = lyd_merge((lyd_node *)plVar6,plVar8,0x500);
      plVar6 = local_38;
      if (iVar4 != 0) {
        pcVar13 = "Adding ietf-yang-library data failed.";
        LVar12 = LY_EINT;
        goto LAB_0014127c;
      }
    }
    for (; plVar7 = local_40, plVar6 != (lys_node *)0x0; plVar6 = *(lys_node **)&plVar6->flags) {
      if ((((((lys_node *)plVar6->name)->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
          (((ulong)plVar6->dsc & 1) != 0)) &&
         (iVar4 = lyv_data_dup((lyd_node *)plVar6,(lyd_node *)local_38), iVar4 != 0))
      goto LAB_0014111d;
    }
    iVar4 = lyd_defaults_add_unres
                      ((lyd_node **)&local_38,(int)local_40,ctx_00,(lys_module **)0x0,0,data_tree,
                       (lyd_node *)local_58,(unres_data *)local_68,1);
    if (iVar4 == 0) {
      if (((ulong)plVar7 & 0x2080) == 0) {
        root = local_58;
        if (local_58 == (undefined1  [8])0x0) {
          root = (undefined1  [8])local_38;
        }
        iVar4 = lyd_check_mandatory_tree((lyd_node *)root,ctx_00,(lys_module **)0x0,0,(int)local_40)
        ;
        if (iVar4 != 0) goto LAB_0014111d;
      }
      plVar8 = local_68;
      free(local_68->schema);
      free(*(UNRES_ITEM **)&plVar8->validity);
      free(plVar8);
      return (lyd_node *)local_38;
    }
  }
LAB_0014111d:
  lyd_free_withsiblings((lyd_node *)local_38);
  if ((node != (lys_node *)0x0) && (local_38 != node)) {
    lyd_free_withsiblings((lyd_node *)node);
  }
  plVar8 = local_68;
  free(local_68->schema);
  free(*(UNRES_ITEM **)&plVar8->validity);
  free(plVar8);
  return (lyd_node *)0x0;
}

Assistant:

struct lyd_node *
lyd_parse_json(struct ly_ctx *ctx, const char *data, int options, const struct lyd_node *rpc_act,
               const struct lyd_node *data_tree, const char *yang_data_name)
{
    struct lyd_node *result = NULL, *next, *iter, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct unres_data *unres = NULL;
    unsigned int len = 0, r;
    int act_cont = 0;
    struct attr_cont *attrs = NULL;

    if (!ctx || !data) {
        LOGARG;
        return NULL;
    }

    /* skip leading whitespaces */
    len += skip_ws(&data[len]);

    /* expect top-level { */
    if (data[len] != '{') {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level begin-object)");
        return NULL;
    }

    /* check for empty object */
    r = len + 1;
    r += skip_ws(&data[r]);
    if (data[r] == '}') {
        if (options & LYD_OPT_DATA_ADD_YANGLIB) {
            result = ly_ctx_info(ctx);
        }
        lyd_validate(&result, options, ctx);
        return result;
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    /* create RPC/action reply part that is not in the parsed data */
    if (rpc_act) {
        assert(options & LYD_OPT_RPCREPLY);
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }

    iter = NULL;
    next = reply_parent;
    do {
        len++;
        len += skip_ws(&data[len]);

        if (!act_cont) {
            if (!strncmp(&data[len], "\"yang:action\"", 13)) {
                len += 13;
                len += skip_ws(&data[len]);
                if (data[len] != ':') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level begin-object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);
                if (data[len] != '{') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level yang:action object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);

                act_cont = 1;
            } else {
                act_cont = -1;
            }
        }

        r = json_parse_data(ctx, &data[len], NULL, &next, result, iter, &attrs, options, unres, &act_notif, yang_data_name);
        if (!r) {
            goto error;
        }
        len += r;

        if (!result) {
            if (reply_parent) {
                result = next->child;
                iter = next->child ? next->child->prev : NULL;
            } else {
                for (iter = next; iter && iter->prev->next; iter = iter->prev);
                result = iter;
                if (iter && (options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                    /* ietf-yang-library data present, so ignore the option to add them */
                    options &= ~LYD_OPT_DATA_ADD_YANGLIB;
                }
                iter = next;
            }
        } else {
            iter = result->prev;
        }
        if (!reply_parent) {
            next = NULL;
        }
    } while (data[len] == ',');

    if (data[len] != '}') {
        /* expecting end-object */
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
        goto error;
    }
    len++;
    len += skip_ws(&data[len]);

    if (act_cont == 1) {
        if (data[len] != '}') {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
            goto error;
        }
        len++;
        len += skip_ws(&data[len]);
    }

    /* store attributes */
    if (store_attrs(ctx, attrs, result, options)) {
        goto error;
    }

    if (reply_top) {
        result = reply_top;
    }

    if (!result) {
        LOGERR(ctx, LY_EVALID, "Model for the data to be linked with not found.");
        goto error;
    }

    /* order the elements by hand as it is not required of the JSON input */
    if ((options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY))) {
        if (lyd_schema_sort(result, 1)) {
            goto error;
        }
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, result, (options & LYD_OPT_RPC ? "action" : "notification"), result->schema->name);
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniquness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add/validate default values, unres */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }

    /* check for missing top level mandatory nodes */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    free(unres->node);
    free(unres->type);
    free(unres);

    return result;

error:
    lyd_free_withsiblings(result);
    if (reply_top && result != reply_top) {
        lyd_free_withsiblings(reply_top);
    }
    free(unres->node);
    free(unres->type);
    free(unres);

    return NULL;
}